

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.h
# Opt level: O2

bool __thiscall Clasp::DefaultUnfoundedCheck::pushTodo(DefaultUnfoundedCheck *this,NodeId at)

{
  pointer pAVar1;
  AtomData AVar2;
  uint local_1c;
  
  AVar2 = (this->atoms_).ebo_.buf[at];
  if (((uint)AVar2 >> 0x1d & 1) == 0) {
    local_1c = at;
    bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&(this->todo_).vec,&local_1c);
    pAVar1 = (this->atoms_).ebo_.buf + local_1c;
    *pAVar1 = (AtomData)((uint)*pAVar1 | 0x20000000);
  }
  return ((uint)AVar2 >> 0x1d & 1) == 0;
}

Assistant:

bool pushTodo(NodeId at) { return (atoms_[at].todo == 0 && (todo_.push(at), atoms_[at].todo = 1) != 0); }